

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test_S2C_RESPONSE_check(void)

{
  int32_t iVar1;
  uint8_t buf1 [1];
  uint8_t buf2 [2];
  uint8_t buf3 [3];
  PipeMsg msg;
  
  MsgHelper::initMsg(&msg,S2C_RESPONSE);
  buf1[0] = '\x02';
  iVar1 = MsgHelper::deserializeMsg(buf1,1,&msg);
  if (iVar1 != 0) {
    __assert_fail("MsgHelper::deserializeMsg(buf1, sizeof(buf1), &msg) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0xbc,"void test_S2C_RESPONSE_check()");
  }
  MsgHelper::destroyMsg(&msg);
  buf2[0] = '\x02';
  buf2[1] = '\x05';
  iVar1 = MsgHelper::deserializeMsg(buf2,2,&msg);
  if (iVar1 == -1) {
    MsgHelper::destroyMsg(&msg);
    buf3[2] = '\x03';
    buf3[0] = '\x02';
    buf3[1] = '\x02';
    iVar1 = MsgHelper::deserializeMsg(buf3,3,&msg);
    if (iVar1 == 2) {
      MsgHelper::destroyMsg(&msg);
      return;
    }
    __assert_fail("MsgHelper::deserializeMsg(buf3, sizeof(buf3), &msg) == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0xc5,"void test_S2C_RESPONSE_check()");
  }
  __assert_fail("MsgHelper::deserializeMsg(buf2, sizeof(buf2), &msg) == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                ,0xc1,"void test_S2C_RESPONSE_check()");
}

Assistant:

void test_S2C_RESPONSE_check()
{
	PipeMsg msg;
	MsgHelper::initMsg(&msg, PIPEMSG_TYPE::S2C_RESPONSE);
	
	const uint8_t buf1[] = {0x02};
	assert(MsgHelper::deserializeMsg(buf1, sizeof(buf1), &msg) == 0);
	MsgHelper::destroyMsg(&msg);
	
	// error: code(0x05) >= S2C_RESPONSE_CODE::CODE_NONE
	const uint8_t buf2[] = {0x02, 0x05};
	assert(MsgHelper::deserializeMsg(buf2, sizeof(buf2), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	const uint8_t buf3[] = {0x02, 0x02, 0x03};
	assert(MsgHelper::deserializeMsg(buf3, sizeof(buf3), &msg) == 2);
	MsgHelper::destroyMsg(&msg);
}